

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_hello_retry_request
              (ptls_t *tls,ptls_message_emitter_t *emitter,st_ptls_server_hello_t *sh,
              ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  int iVar1;
  long in_RDX;
  long *in_RDI;
  ptls_key_schedule_t *in_R9;
  ptls_iovec_t pVar2;
  ptls_key_exchange_algorithm_t **cand;
  int ret;
  ptls_iovec_t *in_stack_00000698;
  ptls_handshake_properties_t *in_stack_000006a0;
  ptls_message_emitter_t *in_stack_000006a8;
  ptls_t *in_stack_000006b0;
  long *in_stack_ffffffffffffffa0;
  code *in_stack_ffffffffffffffa8;
  ptls_key_schedule_t *in_stack_ffffffffffffffb0;
  uint8_t *local_48;
  size_t local_40;
  
  if (in_RDI[0x33] != 0) {
    in_stack_ffffffffffffffa8 = *(code **)(in_RDI[0x33] + 0x18);
    in_stack_ffffffffffffffa0 = in_RDI + 0x33;
    pVar2 = ptls_iovec_init((void *)0x0,0);
    local_48 = pVar2.base;
    local_40 = pVar2.len;
    (*in_stack_ffffffffffffffa8)(in_stack_ffffffffffffffa0,1,0,local_48,local_40);
    in_RDI[0x33] = 0;
  }
  if ((*(byte *)(in_RDI + 0x34) >> 1 & 1) != 0) {
    if (*(long *)(*in_RDI + 0x98) == 0) {
      if (in_RDI[0x1f] == 0) {
        __assert_fail("tls->traffic_protection.enc.aead != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0x912,
                      "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      ptls_aead_free((ptls_aead_context_t *)0x11c97a);
      in_RDI[0x1f] = 0;
    }
    *(byte *)(in_RDI + 0x34) = *(byte *)(in_RDI + 0x34) & 0xfd;
  }
  if (*(short *)(in_RDX + 0x38) == -1) {
    if (in_RDI[0x23] == 0) {
      return 0x2f;
    }
  }
  else {
    for (in_stack_ffffffffffffffb0 = *(ptls_key_schedule_t **)(*in_RDI + 0x10);
        (*(long *)in_stack_ffffffffffffffb0 != 0 &&
        (**(short **)in_stack_ffffffffffffffb0 != *(short *)(in_RDX + 0x38)));
        in_stack_ffffffffffffffb0 =
             (ptls_key_schedule_t *)&in_stack_ffffffffffffffb0->hkdf_label_prefix) {
    }
    if (*(long *)in_stack_ffffffffffffffb0 == 0) {
      return 0x2f;
    }
    in_RDI[0x23] = *(long *)in_stack_ffffffffffffffb0;
  }
  key_schedule_transform_post_ch1hash(in_R9);
  ptls__key_schedule_update_hash
            (in_stack_ffffffffffffffb0,(uint8_t *)in_stack_ffffffffffffffa8,
             (size_t)in_stack_ffffffffffffffa0);
  iVar1 = send_client_hello(in_stack_000006b0,in_stack_000006a8,in_stack_000006a0,in_stack_00000698)
  ;
  return iVar1;
}

Assistant:

static int handle_hello_retry_request(ptls_t *tls, ptls_message_emitter_t *emitter, struct st_ptls_server_hello_t *sh,
                                      ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    int ret;

    if (tls->client.key_share_ctx != NULL) {
        tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, 1, NULL, ptls_iovec_init(NULL, 0));
        tls->client.key_share_ctx = NULL;
    }
    if (tls->client.using_early_data) {
        /* release traffic encryption key so that 2nd CH goes out in cleartext, but keep the epoch at 1 since we've already
         * called derive-secret */
        if (tls->ctx->update_traffic_key == NULL) {
            assert(tls->traffic_protection.enc.aead != NULL);
            ptls_aead_free(tls->traffic_protection.enc.aead);
            tls->traffic_protection.enc.aead = NULL;
        }
        tls->client.using_early_data = 0;
    }

    if (sh->retry_request.selected_group != UINT16_MAX) {
        /* we offer the first key_exchanges[0] as KEY_SHARE unless client.negotiate_before_key_exchange is set */
        ptls_key_exchange_algorithm_t **cand;
        for (cand = tls->ctx->key_exchanges; *cand != NULL; ++cand)
            if ((*cand)->id == sh->retry_request.selected_group)
                break;
        if (*cand == NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        tls->key_share = *cand;
    } else if (tls->key_share != NULL) {
        /* retain the key-share using in first CH, if server does not specify one */
    } else {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    key_schedule_transform_post_ch1hash(tls->key_schedule);
    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    ret = send_client_hello(tls, emitter, properties, &sh->retry_request.cookie);

Exit:
    return ret;
}